

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncQueue.h
# Opt level: O3

void __thiscall
nrg::detail::AsyncQueue<nrg::TimedExecution>::operator()
          (AsyncQueue<nrg::TimedExecution> *this,
          time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *param,TimedCaller *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  TimedCaller local_48;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar3 == 0) {
    paVar2 = &local_48.msg_.field_2;
    local_48.msg_._M_dataplus._M_p = (param_2->msg_)._M_dataplus._M_p;
    paVar1 = &(param_2->msg_).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48.msg_._M_dataplus._M_p == paVar1) {
      local_48.msg_.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_48.msg_.field_2._8_8_ = *(undefined8 *)((long)&(param_2->msg_).field_2 + 8);
      local_48.msg_._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_48.msg_.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    local_48.msg_._M_string_length = (param_2->msg_)._M_string_length;
    (param_2->msg_)._M_dataplus._M_p = (pointer)paVar1;
    (param_2->msg_)._M_string_length = 0;
    (param_2->msg_).field_2._M_local_buf[0] = '\0';
    local_48.started_.__d.__r = (duration)(param_2->started_).__d.__r;
    TimedExecution::push<TimedCaller>(&this->queue_,param,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48.msg_._M_dataplus._M_p != paVar2) {
      operator_delete(local_48.msg_._M_dataplus._M_p,local_48.msg_.field_2._M_allocated_capacity + 1
                     );
    }
    std::condition_variable::notify_one();
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

void operator()(Param&&... param)
    {
        std::lock_guard<std::mutex> lock(guard_);
        AsyncStyle::push(queue_, std::forward<Param>(param)...);
        cond_.notify_one();
    }